

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void make_transform_image
               (png_store *ps,png_byte colour_type,png_byte bit_depth,uint palette_number,
               int interlace_type,png_const_charp name)

{
  int iVar1;
  png_uint_32 pVar2;
  int iVar3;
  png_structp pp_00;
  size_t sVar4;
  size_t sVar5;
  bool local_5fd;
  undefined4 local_5f0 [2];
  png_text text_1;
  png_byte buffer [1024];
  int local_1b0;
  png_uint_32 y;
  int pass;
  int npasses;
  char copy [64];
  undefined4 local_160 [2];
  png_text text;
  size_t pos;
  png_uint_32 w;
  png_uint_32 h;
  png_structp pp;
  png_infop pi;
  jmp_buf exception__env;
  jmp_buf *exception__prev;
  png_store *fault;
  exception_context *the_exception_context;
  png_const_charp name_local;
  int interlace_type_local;
  uint palette_number_local;
  png_byte bit_depth_local;
  png_byte colour_type_local;
  png_store *ps_local;
  
  exception__env[0].__saved_mask.__val[0xf] = (unsigned_long)(ps->exception_context).penv;
  (ps->exception_context).penv = (jmp_buf *)&pi;
  iVar1 = _setjmp((__jmp_buf_tag *)&pi);
  if (iVar1 == 0) {
    do {
      pp_00 = set_store_for_write(ps,(png_infopp)&pp,name);
      if (pp_00 == (png_structp)0x0) {
        (ps->exception_context).v.etmp = ps;
        longjmp((__jmp_buf_tag *)(ps->exception_context).penv,1);
      }
      pVar2 = transform_height(pp_00,colour_type,bit_depth);
      png_set_IHDR(pp_00,pp,0x80,pVar2,bit_depth,colour_type,interlace_type,0,0);
      local_160[0] = 0;
      text._0_8_ = make_transform_image::key;
      text.text = (png_charp)safecat((char *)&pass,0x40,0,ps->wname);
      text.key = (png_charp)&pass;
      text.text_length = 0;
      text.itxt_length = 0;
      text.lang = (png_charp)0x0;
      text.lang_key = text.text;
      png_set_text(pp_00,pp,local_160,1);
      if (colour_type == '\x03') {
        init_standard_palette(ps,pp_00,(png_infop)pp,1 << (bit_depth & 0x1f),1);
      }
      else if (palette_number != 0) {
        set_random_tRNS(pp_00,(png_infop)pp,colour_type,(uint)bit_depth);
      }
      png_write_info(pp_00,pp);
      sVar4 = png_get_rowbytes(pp_00,pp);
      sVar5 = transform_rowsize(pp_00,colour_type,bit_depth);
      if (sVar4 != sVar5) {
        png_error(pp_00,"transform row size incorrect");
      }
      iVar1 = png_set_interlace_handling(pp_00);
      iVar3 = npasses_from_interlace_type(pp_00,interlace_type);
      if (iVar1 != iVar3) {
        png_error(pp_00,"write: png_set_interlace_handling failed");
      }
      for (local_1b0 = 0; local_1b0 < iVar1; local_1b0 = local_1b0 + 1) {
        buffer[0x3fc] = '\0';
        buffer[0x3fd] = '\0';
        buffer[0x3fe] = '\0';
        buffer[0x3ff] = '\0';
        for (; (uint)buffer._1020_4_ < pVar2; buffer._1020_4_ = buffer._1020_4_ + 1) {
          transform_row(pp_00,(png_byte *)&text_1.lang_key,colour_type,bit_depth,buffer._1020_4_);
          local_5fd = local_1b0 == 0 && buffer._1020_4_ == 0;
          choose_random_filter(pp_00,(uint)local_5fd);
          png_write_row(pp_00,&text_1.lang_key);
        }
      }
      local_5f0[0] = 0;
      text_1._0_8_ = make_transform_image::key_1;
      text_1.key = make_transform_image::comment;
      text_1.text = (png_charp)0x3;
      text_1.text_length = 0;
      text_1.itxt_length = 0;
      text_1.lang = (png_charp)0x0;
      png_set_text(pp_00,pp,local_5f0,1);
      png_write_end(pp_00,pp);
      store_storefile(ps,(uint)colour_type + (uint)bit_depth * 8 + palette_number * 0x100 +
                         interlace_type * 0x2000);
      store_write_reset(ps);
      (ps->exception_context).caught = 0;
    } while ((ps->exception_context).caught != 0);
  }
  else {
    (ps->exception_context).caught = 1;
  }
  (ps->exception_context).penv = (jmp_buf *)exception__env[0].__saved_mask.__val[0xf];
  if ((ps->exception_context).caught != 0) {
    store_write_reset((ps->exception_context).v.etmp);
  }
  return;
}

Assistant:

static void
make_transform_image(png_store* const ps, png_byte const colour_type,
    png_byte const bit_depth, unsigned int palette_number,
    int interlace_type, png_const_charp name)
{
   context(ps, fault);

   check_interlace_type(interlace_type);

   Try
   {
      png_infop pi;
      png_structp pp = set_store_for_write(ps, &pi, name);
      png_uint_32 h, w;

      /* In the event of a problem return control to the Catch statement below
       * to do the clean up - it is not possible to 'return' directly from a Try
       * block.
       */
      if (pp == NULL)
         Throw ps;

      w = transform_width(pp, colour_type, bit_depth);
      h = transform_height(pp, colour_type, bit_depth);

      png_set_IHDR(pp, pi, w, h, bit_depth, colour_type, interlace_type,
         PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

#ifdef PNG_TEXT_SUPPORTED
#  if defined(PNG_READ_zTXt_SUPPORTED) && defined(PNG_WRITE_zTXt_SUPPORTED)
#     define TEXT_COMPRESSION PNG_TEXT_COMPRESSION_zTXt
#  else
#     define TEXT_COMPRESSION PNG_TEXT_COMPRESSION_NONE
#  endif
      {
         static char key[] = "image name"; /* must be writeable */
         size_t pos;
         png_text text;
         char copy[FILE_NAME_SIZE];

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         /* Yuck: the text must be writable! */
         pos = safecat(copy, sizeof copy, 0, ps->wname);
         text.text = copy;
         text.text_length = pos;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      if (colour_type == 3) /* palette */
         init_standard_palette(ps, pp, pi, 1U << bit_depth, 1/*do tRNS*/);

#     ifdef PNG_WRITE_tRNS_SUPPORTED
         else if (palette_number)
            set_random_tRNS(pp, pi, colour_type, bit_depth);
#     endif

      png_write_info(pp, pi);

      if (png_get_rowbytes(pp, pi) !=
          transform_rowsize(pp, colour_type, bit_depth))
         png_error(pp, "transform row size incorrect");

      else
      {
         /* Somewhat confusingly this must be called *after* png_write_info
          * because if it is called before, the information in *pp has not been
          * updated to reflect the interlaced image.
          */
         int npasses = set_write_interlace_handling(pp, interlace_type);
         int pass;

         if (npasses != npasses_from_interlace_type(pp, interlace_type))
            png_error(pp, "write: png_set_interlace_handling failed");

         for (pass=0; pass<npasses; ++pass)
         {
            png_uint_32 y;

            /* do_own_interlace is a pre-defined boolean (a #define) which is
             * set if we have to work out the interlaced rows here.
             */
            for (y=0; y<h; ++y)
            {
               png_byte buffer[TRANSFORM_ROWMAX];

               transform_row(pp, buffer, colour_type, bit_depth, y);

#              if do_own_interlace
                  /* If do_own_interlace *and* the image is interlaced we need a
                   * reduced interlace row; this may be reduced to empty.
                   */
                  if (interlace_type == PNG_INTERLACE_ADAM7)
                  {
                     /* The row must not be written if it doesn't exist, notice
                      * that there are two conditions here, either the row isn't
                      * ever in the pass or the row would be but isn't wide
                      * enough to contribute any pixels.  In fact the wPass test
                      * can be used to skip the whole y loop in this case.
                      */
                     if (PNG_ROW_IN_INTERLACE_PASS(y, pass) &&
                         PNG_PASS_COLS(w, pass) > 0)
                        interlace_row(buffer, buffer,
                              bit_size(pp, colour_type, bit_depth), w, pass,
                              0/*data always bigendian*/);
                     else
                        continue;
                  }
#              endif /* do_own_interlace */

               choose_random_filter(pp, pass == 0 && y == 0);
               png_write_row(pp, buffer);
            }
         }
      }

#ifdef PNG_TEXT_SUPPORTED
      {
         static char key[] = "end marker";
         static char comment[] = "end";
         png_text text;

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         text.text = comment;
         text.text_length = (sizeof comment)-1;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      png_write_end(pp, pi);

      /* And store this under the appropriate id, then clean up. */
      store_storefile(ps, FILEID(colour_type, bit_depth, palette_number,
         interlace_type, 0, 0, 0));

      store_write_reset(ps);
   }

   Catch(fault)
   {
      /* Use the png_store returned by the exception. This may help the compiler
       * because 'ps' is not used in this branch of the setjmp.  Note that fault
       * and ps will always be the same value.
       */
      store_write_reset(fault);
   }
}